

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastpackwithoutmask14_16(uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint32_t uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  vpmovsxbd_avx(ZEXT416(0x24181008));
  uVar1 = in[0xf];
  auVar6 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)(in[7] << 2)));
  vpmovsxbd_avx(ZEXT416(0x20140c04));
  auVar8 = vpsllvd_avx2(auVar6,_DAT_00198420);
  auVar9 = vpshufd_avx(auVar6,0x50);
  auVar9 = vpsrlvd_avx2(auVar9,_DAT_001a0cb0);
  uVar2 = in[0xb];
  auVar7 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)uVar2));
  auVar7 = vpsllvd_avx2(auVar7,_DAT_00198410);
  auVar9 = vpblendd_avx2(auVar9,ZEXT416(*in),1);
  auVar9 = vpinsrd_avx(auVar9,auVar6._8_4_ >> 0xc | in[7] << 2,3);
  uVar3 = in[0xd];
  auVar8 = vpternlogd_avx512vl(auVar8,auVar7,auVar9,0xfe);
  uVar4 = in[10];
  auVar9 = vpshufd_avx(auVar6,0xff);
  auVar9 = vpinsrd_avx(auVar9,uVar2,1);
  auVar7 = vpsrlvd_avx2(auVar9,_DAT_001962a0);
  uVar5 = in[0xe];
  *(undefined1 (*) [16])out = auVar8;
  auVar9 = vpinsrd_avx(ZEXT416(uVar4),in[0xc],1);
  auVar8 = vpinsrd_avx(ZEXT416(uVar2),uVar3,1);
  auVar8 = vpsllvd_avx2(auVar8,_DAT_001a0cc0);
  auVar9 = vpsllvd_avx2(auVar9,_DAT_00196210);
  auVar9 = vpternlogd_avx512vl(auVar8,auVar9,auVar7,0xfe);
  *(long *)(out + 4) = auVar9._0_8_;
  out[6] = uVar1 << 0x12 | uVar5 << 4 | uVar3 >> 10;
  return out + 7;
}

Assistant:

uint32_t *__fastpackwithoutmask14_16(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (14 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (14 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (14 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (14 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (14 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (14 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  ++in;

  return out;
}